

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

bool __thiscall leveldb::log::Reader::ReadRecord(Reader *this,Slice *record,string *scratch)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  uint64_t uVar5;
  long local_f8;
  char local_98 [8];
  char buf [40];
  Slice local_68;
  size_t local_58;
  uint64_t physical_record_offset;
  undefined1 auStack_48 [4];
  uint record_type;
  Slice fragment;
  uint64_t prospective_record_offset;
  bool in_fragmented_record;
  string *scratch_local;
  Slice *record_local;
  Reader *this_local;
  
  if ((this->last_record_offset_ < this->initial_offset_) &&
     (bVar1 = SkipToInitialBlock(this), !bVar1)) {
    return false;
  }
  std::__cxx11::string::clear();
  Slice::clear(record);
  bVar1 = false;
  fragment.size_ = 0;
  Slice::Slice((Slice *)auStack_48);
LAB_00108cce:
  physical_record_offset._4_4_ = ReadPhysicalRecord(this,(Slice *)auStack_48);
  uVar5 = this->end_of_buffer_offset_;
  sVar2 = Slice::size(&this->buffer_);
  local_58 = Slice::size((Slice *)auStack_48);
  local_58 = ((uVar5 - sVar2) + -7) - local_58;
  if ((this->resyncing_ & 1U) != 0) goto code_r0x00108d3b;
  goto code_r0x00108d7f;
code_r0x00108d3b:
  if (physical_record_offset._4_4_ != 3) {
    if (physical_record_offset._4_4_ == 4) {
      this->resyncing_ = false;
    }
    else {
      this->resyncing_ = false;
code_r0x00108d7f:
      switch(physical_record_offset._4_4_) {
      case 1:
        if ((bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
          uVar5 = std::__cxx11::string::size();
          ReportCorruption(this,uVar5,"partial record without end(1)");
        }
        fragment.size_ = local_58;
        std::__cxx11::string::clear();
        record->data_ = _auStack_48;
        record->size_ = (size_t)fragment.data_;
        this->last_record_offset_ = fragment.size_;
        return true;
      case 2:
        if ((bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
          uVar5 = std::__cxx11::string::size();
          ReportCorruption(this,uVar5,"partial record without end(2)");
        }
        fragment.size_ = local_58;
        pcVar4 = Slice::data((Slice *)auStack_48);
        Slice::size((Slice *)auStack_48);
        std::__cxx11::string::assign((char *)scratch,(ulong)pcVar4);
        bVar1 = true;
        break;
      case 3:
        if (bVar1) {
          pcVar4 = Slice::data((Slice *)auStack_48);
          Slice::size((Slice *)auStack_48);
          std::__cxx11::string::append((char *)scratch,(ulong)pcVar4);
        }
        else {
          sVar2 = Slice::size((Slice *)auStack_48);
          ReportCorruption(this,sVar2,"missing start of fragmented record(1)");
        }
        break;
      case 4:
        if (bVar1) {
          pcVar4 = Slice::data((Slice *)auStack_48);
          Slice::size((Slice *)auStack_48);
          std::__cxx11::string::append((char *)scratch,(ulong)pcVar4);
          Slice::Slice(&local_68,scratch);
          record->data_ = local_68.data_;
          record->size_ = local_68.size_;
          this->last_record_offset_ = fragment.size_;
          return true;
        }
        sVar2 = Slice::size((Slice *)auStack_48);
        ReportCorruption(this,sVar2,"missing start of fragmented record(2)");
        break;
      case 5:
        if (bVar1) {
          std::__cxx11::string::clear();
        }
        return false;
      case 6:
        if (bVar1) {
          uVar5 = std::__cxx11::string::size();
          ReportCorruption(this,uVar5,"error in middle of record");
          bVar1 = false;
          std::__cxx11::string::clear();
        }
        break;
      default:
        snprintf(local_98,0x28,"unknown record type %u",(ulong)physical_record_offset._4_4_);
        sVar2 = Slice::size((Slice *)auStack_48);
        if (bVar1) {
          local_f8 = std::__cxx11::string::size();
        }
        else {
          local_f8 = 0;
        }
        ReportCorruption(this,sVar2 + local_f8,local_98);
        bVar1 = false;
        std::__cxx11::string::clear();
      }
    }
  }
  goto LAB_00108cce;
}

Assistant:

bool Reader::ReadRecord(Slice* record, std::string* scratch) {
  if (last_record_offset_ < initial_offset_) {
    if (!SkipToInitialBlock()) {
      return false;
    }
  }

  scratch->clear();
  record->clear();
  bool in_fragmented_record = false;
  // Record offset of the logical record that we're reading
  // 0 is a dummy value to make compilers happy
  uint64_t prospective_record_offset = 0;

  Slice fragment;
  while (true) {
    const unsigned int record_type = ReadPhysicalRecord(&fragment);

    // ReadPhysicalRecord may have only had an empty trailer remaining in its
    // internal buffer. Calculate the offset of the next physical record now
    // that it has returned, properly accounting for its header size.
    uint64_t physical_record_offset =
        end_of_buffer_offset_ - buffer_.size() - kHeaderSize - fragment.size();

    if (resyncing_) {
      if (record_type == kMiddleType) {
        continue;
      } else if (record_type == kLastType) {
        resyncing_ = false;
        continue;
      } else {
        resyncing_ = false;
      }
    }

    switch (record_type) {
      case kFullType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(1)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->clear();
        *record = fragment;
        last_record_offset_ = prospective_record_offset;
        return true;

      case kFirstType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(2)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->assign(fragment.data(), fragment.size());
        in_fragmented_record = true;
        break;

      case kMiddleType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(1)");
        } else {
          scratch->append(fragment.data(), fragment.size());
        }
        break;

      case kLastType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(2)");
        } else {
          scratch->append(fragment.data(), fragment.size());
          *record = Slice(*scratch);
          last_record_offset_ = prospective_record_offset;
          return true;
        }
        break;

      case kEof:
        if (in_fragmented_record) {
          // This can be caused by the writer dying immediately after
          // writing a physical record but before completing the next; don't
          // treat it as a corruption, just ignore the entire logical record.
          scratch->clear();
        }
        return false;

      case kBadRecord:
        if (in_fragmented_record) {
          ReportCorruption(scratch->size(), "error in middle of record");
          in_fragmented_record = false;
          scratch->clear();
        }
        break;

      default: {
        char buf[40];
        std::snprintf(buf, sizeof(buf), "unknown record type %u", record_type);
        ReportCorruption(
            (fragment.size() + (in_fragmented_record ? scratch->size() : 0)),
            buf);
        in_fragmented_record = false;
        scratch->clear();
        break;
      }
    }
  }
  return false;
}